

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseexc.hpp
# Opt level: O2

void __thiscall MetaSim::BaseExc::BaseExc(BaseExc *this,string *message,string *cl,string *md)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1d8 [32];
  runtime_error local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"");
  *(undefined ***)this = &PTR__BaseExc_0012b500;
  (this->_what)._M_dataplus._M_p = (pointer)&(this->_what).field_2;
  (this->_what)._M_string_length = 0;
  (this->_what).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Class=");
  poVar1 = std::operator<<(poVar1,(string *)cl);
  poVar1 = std::operator<<(poVar1," Module=");
  poVar1 = std::operator<<(poVar1,(string *)md);
  poVar1 = std::operator<<(poVar1," Message:");
  std::operator<<(poVar1,(string *)message);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(local_1b8,asStack_1d8);
  std::runtime_error::operator=(&this->super_runtime_error,local_1b8);
  std::runtime_error::~runtime_error(local_1b8);
  std::__cxx11::string::~string(asStack_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

BaseExc(const std::string &message,
                const std::string &cl="unknown",
                const std::string &md="unknown") :
          std::runtime_error("")
              {
                  std::stringstream ss;
                  ss << "Class=" << cl
                     << " Module=" << md
                     << " Message:" << message;
                  static_cast<std::runtime_error&>(*this) = std::runtime_error(ss.str());
              }